

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_lock.c
# Opt level: O0

ALLEGRO_LOCKED_REGION * al_lock_bitmap_blocked(ALLEGRO_BITMAP *bitmap,int flags)

{
  int iVar1;
  int mul;
  ALLEGRO_LOCKED_REGION *pAVar2;
  int in_ESI;
  ALLEGRO_BITMAP *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  ALLEGRO_BITMAP *in_stack_00000008;
  int block_height;
  int block_width;
  int bitmap_format;
  
  iVar1 = al_get_bitmap_format(in_RDI);
  mul = al_get_pixel_block_width(iVar1);
  iVar1 = al_get_pixel_block_height(iVar1);
  _al_get_least_multiple(in_RDI->w,mul);
  _al_get_least_multiple(in_RDI->h,iVar1);
  pAVar2 = al_lock_bitmap_region_blocked
                     (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                      (int)in_RDI,in_ESI);
  return pAVar2;
}

Assistant:

ALLEGRO_LOCKED_REGION *al_lock_bitmap_blocked(ALLEGRO_BITMAP *bitmap,
   int flags)
{
   int bitmap_format = al_get_bitmap_format(bitmap);
   int block_width = al_get_pixel_block_width(bitmap_format);
   int block_height = al_get_pixel_block_height(bitmap_format);

   return al_lock_bitmap_region_blocked(bitmap, 0, 0,
      _al_get_least_multiple(bitmap->w, block_width) / block_width,
      _al_get_least_multiple(bitmap->h, block_height) / block_height,
      flags);
}